

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthRoute.cpp
# Opt level: O3

void __thiscall SynthRoute::disableExclusiveMidiMode(SynthRoute *this)

{
  MidiSession *midiSession;
  QDebug this_00;
  iterator iVar1;
  QByteArrayView QVar2;
  QDebug local_58;
  QArrayData *local_50 [3];
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  
  if ((this->exclusiveMidiMode == true) && ((this->midiSessions).d.size != 0)) {
    iVar1 = QList<MidiSession_*>::begin(&this->midiSessions);
    midiSession = *iVar1.i;
    removeMidiSession(this,midiSession);
    this->exclusiveMidiMode = false;
    local_38 = 2;
    local_34 = 0;
    uStack_2c = 0;
    local_24 = 0;
    local_20 = "default";
    QMessageLogger::debug();
    this_00.stream = local_58.stream;
    QVar2.m_data = (storage_type *)0x26;
    QVar2.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,8);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
    exclusiveMidiSessionRemoved(this,midiSession);
  }
  return;
}

Assistant:

void SynthRoute::disableExclusiveMidiMode() {
	if (exclusiveMidiMode && hasMIDISessions()) {
		MidiSession *midiSession = midiSessions.first();
		removeMidiSession(midiSession);
		exclusiveMidiMode = false;
		qDebug() << "SynthRoute: exclusiveMidiMode disabled";
		emit exclusiveMidiSessionRemoved(midiSession);
	}
}